

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

ssl_verify_result_t CustomVerifyCallback(SSL *ssl,uint8_t *out_alert)

{
  bool bVar1;
  int idx;
  ssl_verify_result_t sVar2;
  void *pvVar3;
  TestState *pTVar4;
  
  idx = TestConfigExDataIndex();
  pvVar3 = SSL_get_ex_data((SSL *)ssl,idx);
  bVar1 = CheckVerifyCallback(ssl);
  sVar2 = ssl_verify_invalid;
  if (bVar1) {
    if ((*(char *)((long)pvVar3 + 0x269) == '\x01') &&
       (pTVar4 = GetTestState(ssl), pTVar4->custom_verify_ready != true)) {
      return ssl_verify_retry;
    }
    pTVar4 = GetTestState(ssl);
    pTVar4->cert_verified = true;
    sVar2 = (ssl_verify_result_t)*(byte *)((long)pvVar3 + 0x532);
  }
  return sVar2;
}

Assistant:

static ssl_verify_result_t CustomVerifyCallback(SSL *ssl, uint8_t *out_alert) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return ssl_verify_invalid;
  }

  if (config->async && !GetTestState(ssl)->custom_verify_ready) {
    return ssl_verify_retry;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    return ssl_verify_invalid;
  }

  return ssl_verify_ok;
}